

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDLEventsSourceTests.cpp
# Opt level: O1

void __thiscall
solitaire::events::SDLEventsSourceTests_ignoreEventIfSDLPollEventReturnsNotLeftMouseButtonEvent_Test
::TestBody(SDLEventsSourceTests_ignoreEventIfSDLPollEventReturnsNotLeftMouseButtonEvent_Test *this)

{
  int iVar1;
  TypedExpectation<int_(SDL_Event_&)> *pTVar2;
  ActionInterface<int_(SDL_Event_&)> *impl;
  _func_int__Any_data_ptr_SDL_Event_ptr *__tmp_1;
  _func_bool__Any_data_ptr__Any_data_ptr__Manager_operation *__tmp;
  SDLEventsSource *this_00;
  _func_int *message;
  AssertionResult gtest_ar;
  undefined1 local_98 [16];
  Buffer local_88;
  code *pcStack_80;
  undefined1 local_78 [16];
  VTable *local_68;
  undefined1 local_58 [8];
  MatcherBase<SDL_Event_&> MStack_50;
  MatcherBase<SDL_Event_&> local_38;
  
  local_38.vtable_ =
       (VTable *)
       testing::internal::MatcherBase<SDL_Event&>::
       GetVTable<testing::internal::MatcherBase<SDL_Event&>::ValuePolicy<testing::internal::AnythingMatcher,true>>()
       ::kVTable;
  local_38.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_0032a2c0;
  SDL::WrapperMock::gmock_pollEvent
            ((MockSpec<int_(SDL_Event_&)> *)local_78,
             (this->super_SDLEventsSourceTests).sdlMock.rawPointer,(Matcher<SDL_Event_&> *)&local_38
            );
  testing::internal::GetWithoutMatchers();
  pTVar2 = testing::internal::MockSpec<int_(SDL_Event_&)>::InternalExpectedAt
                     ((MockSpec<int_(SDL_Event_&)> *)local_78,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/events/SDLEventsSourceTests.cpp"
                      ,0x2e,"*sdlMock","pollEvent(_)");
  MStack_50.buffer_.ptr = (void *)0x0;
  MStack_50.vtable_ = (VTable *)0x0;
  MStack_50.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface = (_func_int **)0x0;
  local_58 = (undefined1  [8])0x0;
  pcStack_80 = std::
               _Function_handler<int_(SDL_Event_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/events/SDLEventsSourceTests.cpp:46:57)>
               ::_M_invoke;
  local_88.ptr = std::
                 _Function_handler<int_(SDL_Event_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/events/SDLEventsSourceTests.cpp:46:57)>
                 ::_M_manager;
  local_98._8_8_ = 0;
  local_98._0_8_ = (void *)0x0;
  testing::internal::TypedExpectation<int_(SDL_Event_&)>::WillOnce
            (pTVar2,(Action<int_(SDL_Event_&)> *)local_98);
  if ((_Manager_type)local_88.ptr != (_Manager_type)0x0) {
    (*(code *)local_88)(local_98,local_98,3);
  }
  testing::internal::MatcherBase<SDL_Event_&>::~MatcherBase
            ((MatcherBase<SDL_Event_&> *)(local_78 + 8));
  testing::internal::MatcherBase<SDL_Event_&>::~MatcherBase(&local_38);
  local_38.vtable_ =
       (VTable *)
       testing::internal::MatcherBase<SDL_Event&>::
       GetVTable<testing::internal::MatcherBase<SDL_Event&>::ValuePolicy<testing::internal::AnythingMatcher,true>>()
       ::kVTable;
  local_38.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_0032a2c0;
  SDL::WrapperMock::gmock_pollEvent
            ((MockSpec<int_(SDL_Event_&)> *)local_78,
             (this->super_SDLEventsSourceTests).sdlMock.rawPointer,(Matcher<SDL_Event_&> *)&local_38
            );
  testing::internal::GetWithoutMatchers();
  pTVar2 = testing::internal::MockSpec<int_(SDL_Event_&)>::InternalExpectedAt
                     ((MockSpec<int_(SDL_Event_&)> *)local_78,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/events/SDLEventsSourceTests.cpp"
                      ,0x34,"*sdlMock","pollEvent(_)");
  MStack_50.buffer_.ptr = (void *)0x0;
  MStack_50.vtable_ = (VTable *)0x0;
  MStack_50.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface = (_func_int **)0x0;
  local_58 = (undefined1  [8])0x0;
  pcStack_80 = std::
               _Function_handler<int_(SDL_Event_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/events/SDLEventsSourceTests.cpp:52:57)>
               ::_M_invoke;
  local_88.ptr = std::
                 _Function_handler<int_(SDL_Event_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/events/SDLEventsSourceTests.cpp:52:57)>
                 ::_M_manager;
  local_98._8_8_ = 0;
  local_98._0_8_ = (void *)0x0;
  testing::internal::TypedExpectation<int_(SDL_Event_&)>::WillOnce
            (pTVar2,(Action<int_(SDL_Event_&)> *)local_98);
  if ((_Manager_type)local_88.ptr != (_Manager_type)0x0) {
    (*(code *)local_88)(local_98,local_98,3);
  }
  testing::internal::MatcherBase<SDL_Event_&>::~MatcherBase
            ((MatcherBase<SDL_Event_&> *)(local_78 + 8));
  testing::internal::MatcherBase<SDL_Event_&>::~MatcherBase(&local_38);
  local_98._8_8_ =
       testing::internal::MatcherBase<SDL_Event&>::
       GetVTable<testing::internal::MatcherBase<SDL_Event&>::ValuePolicy<testing::internal::AnythingMatcher,true>>()
       ::kVTable;
  local_98._0_8_ = &PTR__MatcherBase_0032a2c0;
  SDL::WrapperMock::gmock_pollEvent
            ((MockSpec<int_(SDL_Event_&)> *)local_58,
             (this->super_SDLEventsSourceTests).sdlMock.rawPointer,(Matcher<SDL_Event_&> *)local_98)
  ;
  testing::internal::GetWithoutMatchers();
  pTVar2 = testing::internal::MockSpec<int_(SDL_Event_&)>::InternalExpectedAt
                     ((MockSpec<int_(SDL_Event_&)> *)local_58,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/events/SDLEventsSourceTests.cpp"
                      ,0x3a,"*sdlMock","pollEvent(_)");
  local_38.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)operator_new(4);
  *(int *)local_38.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface = 0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<int*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_38.vtable_,
             (int *)local_38.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface);
  impl = (ActionInterface<int_(SDL_Event_&)> *)operator_new(0x10);
  impl->_vptr_ActionInterface = (_func_int **)&PTR__ActionInterface_0032b428;
  iVar1 = *(int *)local_38.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface;
  *(int *)&impl[1]._vptr_ActionInterface = iVar1;
  *(int *)((long)&impl[1]._vptr_ActionInterface + 4) = iVar1;
  testing::Action<int_(SDL_Event_&)>::Action((Action<int_(SDL_Event_&)> *)local_78,impl);
  this_00 = (SDLEventsSource *)local_78;
  testing::internal::TypedExpectation<int_(SDL_Event_&)>::WillOnce
            (pTVar2,(Action<int_(SDL_Event_&)> *)this_00);
  if (local_68 != (VTable *)0x0) {
    this_00 = (SDLEventsSource *)local_78;
    (*(code *)local_68)(this_00,this_00,3);
  }
  if (local_38.vtable_ != (VTable *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38.vtable_);
  }
  testing::internal::MatcherBase<SDL_Event_&>::~MatcherBase
            ((MatcherBase<SDL_Event_&> *)(local_58 + 8));
  testing::internal::MatcherBase<SDL_Event_&>::~MatcherBase((MatcherBase<SDL_Event_&> *)local_98);
  local_78._0_8_ =
       SDLEventsSource::getEvent((Event *)&(this->super_SDLEventsSourceTests).eventsSource,this_00);
  std::
  get<0ul,solitaire::events::NoEvents,solitaire::events::MouseLeftButtonDown,solitaire::events::MouseLeftButtonUp,solitaire::events::MouseMove,solitaire::events::Quit>
            ((variant<solitaire::events::NoEvents,_solitaire::events::MouseLeftButtonDown,_solitaire::events::MouseLeftButtonUp,_solitaire::events::MouseMove,_solitaire::events::Quit>
              *)local_78);
  testing::AssertionSuccess();
  if (local_58[0] == '\0') {
    testing::Message::Message((Message *)local_78);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        MStack_50.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = (_func_int *)0x29ccc7;
    }
    else {
      message = *MStack_50.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/events/SDLEventsSourceTests.cpp"
               ,0x3b,(char *)message);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_98,(Message *)local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_98);
    if ((FunctionMocker<int_(SDL_Event_&)> *)local_78._0_8_ !=
        (FunctionMocker<int_(SDL_Event_&)> *)0x0) {
      (**(code **)(*(long *)local_78._0_8_ + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      MStack_50.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_58 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 MStack_50.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface);
  }
  return;
}

Assistant:

TEST_F(SDLEventsSourceTests, ignoreEventIfSDLPollEventReturnsNotLeftMouseButtonEvent) {
    EXPECT_CALL(*sdlMock, pollEvent(_)).WillOnce(Invoke([](auto& event) {
        event.type = SDL_MOUSEBUTTONDOWN;
        event.button.button = SDL_BUTTON_RIGHT;
        return 1;
    }));

    EXPECT_CALL(*sdlMock, pollEvent(_)).WillOnce(Invoke([](auto& event) {
        event.type = SDL_MOUSEBUTTONUP;
        event.button.button = SDL_BUTTON_RIGHT;
        return 1;
    }));

    EXPECT_CALL(*sdlMock, pollEvent(_)).WillOnce(Return(0));
    EXPECT_EQ(std::get<NoEvents>(eventsSource.getEvent()), NoEvents {});
}